

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_get_block_info(Integer g_a,Integer *num_blocks,Integer *block_dims)

{
  short sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Integer bsize;
  Integer dim;
  Integer ndim;
  Integer i;
  Integer ga_handle;
  Integer in_stack_00000158;
  char *in_stack_00000160;
  long local_28;
  
  lVar4 = in_RDI + 1000;
  sVar1 = GA[lVar4].ndim;
  if ((GA[lVar4].distr_type == 2) || (GA[lVar4].distr_type == 3)) {
    for (local_28 = 0; local_28 < sVar1; local_28 = local_28 + 1) {
      *(C_Integer *)(in_RSI + local_28 * 8) = GA[lVar4].num_blocks[local_28];
      *(C_Integer *)(in_RDX + local_28 * 8) = GA[lVar4].block_dims[local_28];
    }
  }
  else if (GA[lVar4].distr_type == 4) {
    pnga_error(in_stack_00000160,in_stack_00000158);
  }
  else {
    for (local_28 = 0; local_28 < sVar1; local_28 = local_28 + 1) {
      lVar2 = GA[lVar4].dims[local_28];
      lVar3 = GA[lVar4].block_dims[local_28];
      if (lVar3 < 1) {
        *(undefined8 *)(in_RSI + local_28 * 8) = 0;
      }
      else if (lVar2 % lVar3 == 0) {
        *(long *)(in_RSI + local_28 * 8) = lVar2 / lVar3;
      }
      else {
        *(long *)(in_RSI + local_28 * 8) = lVar2 / lVar3 + 1;
      }
      *(C_Integer *)(in_RDX + local_28 * 8) = GA[lVar4].block_dims[local_28];
    }
  }
  return;
}

Assistant:

void pnga_get_block_info(Integer g_a, Integer *num_blocks, Integer *block_dims)
{
  Integer ga_handle = GA_OFFSET + g_a;
  Integer i, ndim;
  ndim = GA[ga_handle].ndim; 
  if (GA[ga_handle].distr_type == SCALAPACK ||
      GA[ga_handle].distr_type == TILED) {
    for (i=0; i<ndim; i++) {
      num_blocks[i] = GA[ga_handle].num_blocks[i];
      block_dims[i] = GA[ga_handle].block_dims[i];
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    /* not sure what to do here */
    pnga_error("Don't know how to respond to get_block_infor for"
        " irregular tiled array",0);
  } else {
    Integer dim, bsize;
    for (i=0; i<ndim; i++) {
      dim = GA[ga_handle].dims[i];
      bsize = GA[ga_handle].block_dims[i];
      if (bsize > 0) {
        if (dim%bsize == 0) {
          num_blocks[i] = dim/bsize;
        } else {
          num_blocks[i] = dim/bsize+1;
        }
      } else {
        num_blocks[i] = 0;
      }
      block_dims[i] = GA[ga_handle].block_dims[i];
    }
  }
  return;
}